

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialStatistics.cpp
# Opt level: O0

void __thiscall OpenMD::ShellStatistics::processFrame(ShellStatistics *this,int istep)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  SelectionManager *in_RDI;
  int in_stack_0000000c;
  SpatialStatistics *in_stack_00000010;
  StuntDouble *sd;
  int isd;
  Vector3<double> *in_stack_ffffffffffffff88;
  pointer *this_00;
  StuntDouble *this_01;
  SelectionEvaluator *in_stack_ffffffffffffffc8;
  
  bVar1 = SelectionEvaluator::isDynamic
                    ((SelectionEvaluator *)
                     &in_RDI[10].stuntdoubles_.
                      super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    this_00 = &in_RDI[9].stuntdoubles_.
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    this_01 = (StuntDouble *)&stack0xffffffffffffffd8;
    SelectionEvaluator::evaluate(in_stack_ffffffffffffffc8);
    SelectionManager::setSelectionSet(in_RDI,(SelectionSet *)this_01);
    SelectionSet::~SelectionSet((SelectionSet *)0x1ba680);
    iVar2 = SelectionManager::getSelectionCount((SelectionManager *)0x1ba691);
    if (iVar2 != 1) {
      uVar3 = SelectionManager::getSelectionCount((SelectionManager *)0x1ba6a7);
      snprintf(painCave.errMsg,2000,
               "ShellStatistics: More than one selected object in comsele.\n\tThere are %d selected objects.\n"
               ,(ulong)uVar3);
      painCave.isFatal = 1;
      simError();
    }
    SelectionManager::beginSelected(in_RDI,(int *)this_01);
    StuntDouble::getPos(this_01);
    Vector3<double>::operator=((Vector3<double> *)this_00,in_stack_ffffffffffffff88);
    SpatialStatistics::processFrame(in_stack_00000010,in_stack_0000000c);
  }
  return;
}

Assistant:

void ShellStatistics::processFrame(int istep) {
    if (comEvaluator_.isDynamic()) {
      comSeleMan_.setSelectionSet(comEvaluator_.evaluate());
      if (comSeleMan_.getSelectionCount() != 1) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "ShellStatistics: More than one selected object in "
                 "comsele.\n"
                 "\tThere are %d selected objects.\n",
                 comSeleMan_.getSelectionCount());
        painCave.isFatal = 1;
        simError();
      }
      int isd;
      StuntDouble* sd   = comSeleMan_.beginSelected(isd);
      coordinateOrigin_ = sd->getPos();

      SpatialStatistics::processFrame(istep);
    }
  }